

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llhttp.c
# Opt level: O3

int llhttp__internal__c_mul_add_status_code
              (llhttp__internal_t *state,uchar *p,uchar *endp,int match)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = state->status_code;
  iVar3 = 1;
  if (uVar1 < 0x199a) {
    iVar3 = (uint)uVar1 + (uint)uVar1;
    uVar2 = iVar3 * 5;
    state->status_code = (uint16_t)uVar2;
    if (match < 0) {
      if (uVar2 < (uint)-match) {
        return 1;
      }
    }
    else if (SBORROW4(0xffff - match,uVar2) != (0xffff - match) + iVar3 * -5 < 0) {
      return 1;
    }
    state->status_code = (short)match + (uint16_t)uVar2;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int llhttp__internal__c_mul_add_status_code(
    llhttp__internal_t* state,
    const unsigned char* p,
    const unsigned char* endp,
    int match) {
  /* Multiplication overflow */
  if (state->status_code > 0xffff / 10) {
    return 1;
  }
  
  state->status_code *= 10;
  
  /* Addition overflow */
  if (match >= 0) {
    if (state->status_code > 0xffff - match) {
      return 1;
    }
  } else {
    if (state->status_code < 0 - match) {
      return 1;
    }
  }
  state->status_code += match;
  return 0;
}